

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O0

QString * QMakeEvaluator::quoteValue(ProString *val)

{
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  QLatin1StringView s_03;
  QLatin1StringView s_04;
  QLatin1StringView s_05;
  QLatin1StringView s_06;
  QLatin1StringView s_07;
  bool bVar1;
  int iVar2;
  QChar *pQVar3;
  char16_t *pcVar4;
  ProString *in_RSI;
  QLatin1String *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  ushort uc;
  int l;
  int i;
  bool escaping;
  bool quote;
  QChar *chars;
  QString *ret;
  QChar c;
  undefined4 in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffebc;
  undefined2 in_stack_fffffffffffffec0;
  char16_t in_stack_fffffffffffffec2;
  char16_t in_stack_fffffffffffffec4;
  unsigned_short in_stack_fffffffffffffec6;
  QLatin1String *this;
  undefined2 in_stack_fffffffffffffed8;
  char16_t cVar6;
  undefined2 uVar7;
  QChar QVar8;
  int local_120;
  bool local_119;
  qsizetype in_stack_fffffffffffffee8;
  QLatin1Char local_f5 [4];
  QLatin1Char local_f1 [4];
  QLatin1Char local_ed [3];
  char16_t local_ea;
  QLatin1Char local_97 [4];
  QLatin1Char local_93 [3];
  storage_type *local_90;
  undefined1 local_80 [118];
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->m_size)->d = (Data *)0xaaaaaaaaaaaaaaaa;
  in_RDI->m_data = (char *)0xaaaaaaaaaaaaaaaa;
  in_RDI[1].m_size = -0x5555555555555556;
  this = in_RDI;
  QString::QString((QString *)0x2c61ed);
  ProString::size(in_RSI);
  QString::reserve((QString *)this,in_stack_fffffffffffffee8);
  pQVar3 = ProString::constData
                     ((ProString *)
                      CONCAT26(in_stack_fffffffffffffec6,
                               CONCAT24(in_stack_fffffffffffffec4,
                                        CONCAT22(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0
                                                ))));
  local_119 = ProString::isEmpty(in_RSI);
  bVar1 = false;
  local_120 = 0;
  iVar2 = ProString::size(in_RSI);
  uVar7 = (undefined2)iVar2;
  QVar8.ucs = (char16_t)((uint)iVar2 >> 0x10);
  do {
    if (CONCAT22(QVar8.ucs,uVar7) <= local_120) {
      if (bVar1) {
        QLatin1Char::QLatin1Char(local_ed,')');
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)CONCAT26(in_stack_fffffffffffffec6,
                                     CONCAT24(in_stack_fffffffffffffec4,
                                              CONCAT22(in_stack_fffffffffffffec2,
                                                       in_stack_fffffffffffffec0))),
                   (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
        QString::operator+=((QString *)
                            CONCAT26(in_stack_fffffffffffffec6,
                                     CONCAT24(in_stack_fffffffffffffec4,
                                              CONCAT22(in_stack_fffffffffffffec2,
                                                       in_stack_fffffffffffffec0))),
                            (QChar)(char16_t)((ulong)in_RDI >> 0x30));
      }
      QVar8.ucs = (char16_t)this;
      if (local_119 != false) {
        QLatin1Char::QLatin1Char(local_f1,'\"');
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)CONCAT26(in_stack_fffffffffffffec6,
                                     CONCAT24(in_stack_fffffffffffffec4,
                                              CONCAT22(in_stack_fffffffffffffec2,
                                                       in_stack_fffffffffffffec0))),
                   (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
        QString::prepend((QString *)
                         CONCAT26(in_stack_fffffffffffffec6,
                                  CONCAT24(in_stack_fffffffffffffec4,
                                           CONCAT22(in_stack_fffffffffffffec2,
                                                    in_stack_fffffffffffffec0))),
                         (QChar)(char16_t)((ulong)in_RDI >> 0x30));
        QLatin1Char::QLatin1Char(local_f5,'\"');
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)CONCAT26(in_stack_fffffffffffffec6,
                                     CONCAT24(in_stack_fffffffffffffec4,
                                              CONCAT22(in_stack_fffffffffffffec2,
                                                       in_stack_fffffffffffffec0))),
                   (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
        QString::append(QVar8);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (QString *)in_RDI;
      }
      __stack_chk_fail();
    }
    local_a.ucs = pQVar3[local_120].ucs;
    pcVar4 = QChar::unicode(&local_a);
    cVar6 = *pcVar4;
    if ((ushort)cVar6 < 0x20) {
      in_stack_fffffffffffffec4 = cVar6;
      if (!bVar1) {
        bVar1 = true;
        QLatin1String::QLatin1String(this,(char *)in_RDI);
        s.m_data._0_2_ = in_stack_fffffffffffffed8;
        s.m_size = (qsizetype)this;
        s.m_data._2_2_ = cVar6;
        s.m_data._4_2_ = uVar7;
        s.m_data._6_2_ = QVar8.ucs;
        QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                            ,s);
        in_stack_fffffffffffffec4 = cVar6;
      }
      in_stack_fffffffffffffec6 = 0;
      if (in_stack_fffffffffffffec4 == L'\t') {
        cVar6 = in_stack_fffffffffffffec4;
        QLatin1String::QLatin1String(this,(char *)in_RDI);
        s_02.m_data._0_2_ = in_stack_fffffffffffffed8;
        s_02.m_size = (qsizetype)this;
        s_02.m_data._2_2_ = cVar6;
        s_02.m_data._4_2_ = uVar7;
        s_02.m_data._6_2_ = QVar8.ucs;
        QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                            ,s_02);
      }
      else if (in_stack_fffffffffffffec4 == L'\n') {
        cVar6 = in_stack_fffffffffffffec4;
        QLatin1String::QLatin1String(this,(char *)in_RDI);
        s_01.m_data._0_2_ = in_stack_fffffffffffffed8;
        s_01.m_size = (qsizetype)this;
        s_01.m_data._2_2_ = cVar6;
        s_01.m_data._4_2_ = uVar7;
        s_01.m_data._6_2_ = QVar8.ucs;
        QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                            ,s_01);
      }
      else if (in_stack_fffffffffffffec4 == L'\r') {
        cVar6 = in_stack_fffffffffffffec4;
        QLatin1String::QLatin1String(this,(char *)in_RDI);
        s_00.m_data._0_2_ = in_stack_fffffffffffffed8;
        s_00.m_size = (qsizetype)this;
        s_00.m_data._2_2_ = cVar6;
        s_00.m_data._4_2_ = uVar7;
        s_00.m_data._6_2_ = QVar8.ucs;
        QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                            ,s_00);
      }
      else {
        in_stack_fffffffffffffec2 = in_stack_fffffffffffffec4;
        QByteArrayView::QByteArrayView<6ul>((QByteArrayView *)this,(char (*) [6])in_RDI);
        QVar5.m_data = local_90;
        QVar5.m_size = (qsizetype)local_80;
        QString::fromLatin1(QVar5);
        QLatin1Char::QLatin1Char(local_93,'0');
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)CONCAT26(in_stack_fffffffffffffec6,
                                     CONCAT24(in_stack_fffffffffffffec4,
                                              CONCAT22(in_stack_fffffffffffffec2,
                                                       in_stack_fffffffffffffec0))),
                   (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
        QString::arg<unsigned_short,_true>
                  ((QString *)in_RDI,in_stack_fffffffffffffec6,
                   CONCAT22(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0),
                   in_stack_fffffffffffffebc,QVar8);
        QString::operator+=((QString *)
                            CONCAT26(in_stack_fffffffffffffec6,
                                     CONCAT24(in_stack_fffffffffffffec4,
                                              CONCAT22(in_stack_fffffffffffffec2,
                                                       in_stack_fffffffffffffec0))),
                            (QString *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                           );
        QString::~QString((QString *)0x2c6447);
        QString::~QString((QString *)0x2c6454);
      }
    }
    else {
      if (bVar1) {
        bVar1 = false;
        QLatin1Char::QLatin1Char(local_97,')');
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)CONCAT26(in_stack_fffffffffffffec6,
                                     CONCAT24(in_stack_fffffffffffffec4,
                                              CONCAT22(in_stack_fffffffffffffec2,
                                                       in_stack_fffffffffffffec0))),
                   (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
        QString::operator+=((QString *)
                            CONCAT26(in_stack_fffffffffffffec6,
                                     CONCAT24(in_stack_fffffffffffffec4,
                                              CONCAT22(in_stack_fffffffffffffec2,
                                                       in_stack_fffffffffffffec0))),
                            (QChar)(char16_t)((ulong)in_RDI >> 0x30));
      }
      in_stack_fffffffffffffebc = (uint)(ushort)cVar6;
      if (in_stack_fffffffffffffebc == 0x20) {
        local_119 = true;
LAB_002c65de:
        local_ea = local_a.ucs;
        QString::operator+=((QString *)
                            CONCAT26(in_stack_fffffffffffffec6,
                                     CONCAT24(in_stack_fffffffffffffec4,
                                              CONCAT22(in_stack_fffffffffffffec2,
                                                       in_stack_fffffffffffffec0))),
                            (QChar)(char16_t)((ulong)in_RDI >> 0x30));
      }
      else if (in_stack_fffffffffffffebc == 0x22) {
        QLatin1String::QLatin1String(this,(char *)in_RDI);
        s_04.m_data._0_2_ = in_stack_fffffffffffffed8;
        s_04.m_size = (qsizetype)this;
        s_04.m_data._2_2_ = cVar6;
        s_04.m_data._4_2_ = uVar7;
        s_04.m_data._6_2_ = QVar8.ucs;
        QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                            ,s_04);
      }
      else if (in_stack_fffffffffffffebc == 0x23) {
        QLatin1String::QLatin1String(this,(char *)in_RDI);
        s_07.m_data._0_2_ = in_stack_fffffffffffffed8;
        s_07.m_size = (qsizetype)this;
        s_07.m_data._2_2_ = cVar6;
        s_07.m_data._4_2_ = uVar7;
        s_07.m_data._6_2_ = QVar8.ucs;
        QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                            ,s_07);
      }
      else if (in_stack_fffffffffffffebc == 0x24) {
        QLatin1String::QLatin1String(this,(char *)in_RDI);
        s_06.m_data._0_2_ = in_stack_fffffffffffffed8;
        s_06.m_size = (qsizetype)this;
        s_06.m_data._2_2_ = cVar6;
        s_06.m_data._4_2_ = uVar7;
        s_06.m_data._6_2_ = QVar8.ucs;
        QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                            ,s_06);
      }
      else if (in_stack_fffffffffffffebc == 0x27) {
        QLatin1String::QLatin1String(this,(char *)in_RDI);
        s_05.m_data._0_2_ = in_stack_fffffffffffffed8;
        s_05.m_size = (qsizetype)this;
        s_05.m_data._2_2_ = cVar6;
        s_05.m_data._4_2_ = uVar7;
        s_05.m_data._6_2_ = QVar8.ucs;
        QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                            ,s_05);
      }
      else {
        if (in_stack_fffffffffffffebc != 0x5c) goto LAB_002c65de;
        QLatin1String::QLatin1String(this,(char *)in_RDI);
        s_03.m_data._0_2_ = in_stack_fffffffffffffed8;
        s_03.m_size = (qsizetype)this;
        s_03.m_data._2_2_ = cVar6;
        s_03.m_data._4_2_ = uVar7;
        s_03.m_data._6_2_ = QVar8.ucs;
        QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                            ,s_03);
      }
    }
    local_120 = local_120 + 1;
  } while( true );
}

Assistant:

QString
QMakeEvaluator::quoteValue(const ProString &val)
{
    QString ret;
    ret.reserve(val.size());
    const QChar *chars = val.constData();
    bool quote = val.isEmpty();
    bool escaping = false;
    for (int i = 0, l = val.size(); i < l; i++) {
        QChar c = chars[i];
        ushort uc = c.unicode();
        if (uc < 32) {
            if (!escaping) {
                escaping = true;
                ret += QLatin1String("$$escape_expand(");
            }
            switch (uc) {
            case '\r':
                ret += QLatin1String("\\\\r");
                break;
            case '\n':
                ret += QLatin1String("\\\\n");
                break;
            case '\t':
                ret += QLatin1String("\\\\t");
                break;
            default:
                ret += QString::fromLatin1("\\\\x%1").arg(uc, 2, 16, QLatin1Char('0'));
                break;
            }
        } else {
            if (escaping) {
                escaping = false;
                ret += QLatin1Char(')');
            }
            switch (uc) {
            case '\\':
                ret += QLatin1String("\\\\");
                break;
            case '"':
                ret += QLatin1String("\\\"");
                break;
            case '\'':
                ret += QLatin1String("\\'");
                break;
            case '$':
                ret += QLatin1String("\\$");
                break;
            case '#':
                ret += QLatin1String("$${LITERAL_HASH}");
                break;
            case 32:
                quote = true;
                Q_FALLTHROUGH();
            default:
                ret += c;
                break;
            }
        }
    }
    if (escaping)
        ret += QLatin1Char(')');
    if (quote) {
        ret.prepend(QLatin1Char('"'));
        ret.append(QLatin1Char('"'));
    }
    return ret;
}